

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O2

void __thiscall Company::Company(Company *this,Company *cp)

{
  uint uVar1;
  int iVar2;
  Boss *this_00;
  Employee **ppEVar3;
  Employee *this_01;
  ulong uVar4;
  long lVar5;
  
  this->budget = cp->budget;
  this_00 = (Boss *)operator_new(0xc0);
  Boss::Boss(this_00,cp->boss);
  this->boss = this_00;
  uVar1 = Boss::getNumberOfEmployees(this_00);
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)uVar1) {
    uVar4 = (ulong)uVar1 << 3;
  }
  ppEVar3 = (Employee **)operator_new__(uVar4);
  this->employees = ppEVar3;
  lVar5 = 0;
  while( true ) {
    iVar2 = Boss::getNumberOfEmployees(this->boss);
    if (iVar2 <= lVar5) break;
    this_01 = (Employee *)operator_new(0xb8);
    Employee::Employee(this_01,cp->employees[lVar5]);
    this->employees[lVar5] = this_01;
    lVar5 = lVar5 + 1;
  }
  return;
}

Assistant:

Company::Company(const Company &cp) {
    budget = cp.budget;
    boss = new Boss(*cp.boss);
    employees = new Employee *[boss->getNumberOfEmployees()];
    for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
        employees[i] = new Employee(*cp.employees[i]);
    }
}